

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall wallet::CWallet::ForEachAddrBookEntry(CWallet *this,ListAddrBookFunc *func)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var3 = (this->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_address_book)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    paVar1 = &local_50.field_2;
    do {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      if (*(char *)&p_Var3[4]._M_left == '\x01') {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,p_Var3[3]._M_left,
                   (long)&(p_Var3[3]._M_left)->_M_color + (long)&(p_Var3[3]._M_right)->_M_color);
        bVar2 = *(byte *)&p_Var3[4]._M_left ^ 1;
      }
      else {
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        bVar2 = 1;
      }
      std::
      function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_std::optional<wallet::AddressPurpose>)>
      ::operator()(func,(variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)(p_Var3 + 1),&local_50,(bool)(bVar2 & 1),
                   (optional<wallet::AddressPurpose>)p_Var3[4]._M_right);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::ForEachAddrBookEntry(const ListAddrBookFunc& func) const
{
    AssertLockHeld(cs_wallet);
    for (const std::pair<const CTxDestination, CAddressBookData>& item : m_address_book) {
        const auto& entry = item.second;
        func(item.first, entry.GetLabel(), entry.IsChange(), entry.purpose);
    }
}